

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

NodeSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::newGroupNode
          (NodeSourceInfoBuilderPair *__return_storage_ptr__,StructTranslator *this,Reader parent,
          Reader decl)

{
  NodeTranslator *pNVar1;
  bool value;
  uint32_t uVar2;
  size_t sVar3;
  size_t sVar4;
  AuxNode *params;
  Reader *in_R8;
  Reader RVar5;
  Builder local_170;
  Builder local_148;
  undefined1 local_129;
  ArrayPtr<const_char> local_128;
  String local_118;
  ArrayPtr<const_char> local_100;
  Reader local_f0;
  undefined1 local_c0 [8];
  Reader name;
  BuilderFor<capnp::schema::Node::SourceInfo> sourceInfo;
  BuilderFor<capnp::schema::Node> node;
  undefined1 local_50 [8];
  AuxNode aux;
  StructTranslator *this_local;
  
  aux.sourceInfo.builder.location = (word *)this;
  Orphanage::newOrphan<capnp::schema::Node>
            ((Orphan<capnp::schema::Node> *)local_50,&this->translator->orphanage);
  Orphanage::newOrphan<capnp::schema::Node::SourceInfo>
            ((Orphan<capnp::schema::Node::SourceInfo> *)&aux.node.builder.location,
             &this->translator->orphanage);
  Orphan<capnp::schema::Node>::get
            ((BuilderFor<capnp::schema::Node> *)&sourceInfo._builder.dataSize,
             (Orphan<capnp::schema::Node> *)local_50);
  Orphan<capnp::schema::Node::SourceInfo>::get
            ((BuilderFor<capnp::schema::Node::SourceInfo> *)&name.super_StringPtr.content.size_,
             (Orphan<capnp::schema::Node::SourceInfo> *)&aux.node.builder.location);
  Declaration::Reader::getName(&local_f0,&decl);
  RVar5 = LocatedText::Reader::getValue(&local_f0);
  name.super_StringPtr.content.ptr = RVar5.super_StringPtr.content.size_;
  local_c0 = RVar5.super_StringPtr.content.ptr;
  local_128 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&parent);
  local_129 = 0x2e;
  kj::str<capnp::Text::Reader,char,capnp::Text::Reader&>
            (&local_118,(kj *)&local_128,(Reader *)&local_129,local_c0,in_R8);
  Text::Reader::Reader((Reader *)&local_100,&local_118);
  capnp::schema::Node::Builder::setDisplayName
            ((Builder *)&sourceInfo._builder.dataSize,(Reader)local_100);
  kj::String::~String(&local_118);
  capnp::schema::Node::Builder::getDisplayName(&local_148,(Builder *)&sourceInfo._builder.dataSize);
  sVar3 = Text::Builder::size(&local_148);
  sVar4 = kj::StringPtr::size((StringPtr *)local_c0);
  capnp::schema::Node::Builder::setDisplayNamePrefixLength
            ((Builder *)&sourceInfo._builder.dataSize,(int)sVar3 - (int)sVar4);
  value = capnp::schema::Node::Reader::getIsGeneric(&parent);
  capnp::schema::Node::Builder::setIsGeneric((Builder *)&sourceInfo._builder.dataSize,value);
  capnp::schema::Node::Builder::initStruct(&local_170,(Builder *)&sourceInfo._builder.dataSize);
  capnp::schema::Node::Struct::Builder::setIsGroup(&local_170,true);
  uVar2 = Declaration::Reader::getStartByte(&decl);
  capnp::schema::Node::Builder::setStartByte((Builder *)&sourceInfo._builder.dataSize,uVar2);
  uVar2 = Declaration::Reader::getEndByte(&decl);
  capnp::schema::Node::Builder::setEndByte((Builder *)&sourceInfo._builder.dataSize,uVar2);
  uVar2 = Declaration::Reader::getStartByte(&decl);
  capnp::schema::Node::SourceInfo::Builder::setStartByte
            ((Builder *)&name.super_StringPtr.content.size_,uVar2);
  uVar2 = Declaration::Reader::getEndByte(&decl);
  capnp::schema::Node::SourceInfo::Builder::setEndByte
            ((Builder *)&name.super_StringPtr.content.size_,uVar2);
  pNVar1 = this->translator;
  params = kj::mv<capnp::compiler::NodeTranslator::AuxNode>((AuxNode *)local_50);
  kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::
  add<capnp::compiler::NodeTranslator::AuxNode>(&pNVar1->groups,params);
  memcpy(__return_storage_ptr__,&sourceInfo._builder.dataSize,0x28);
  memcpy(&__return_storage_ptr__->sourceInfo,&name.super_StringPtr.content.size_,0x28);
  AuxNode::~AuxNode((AuxNode *)local_50);
  return __return_storage_ptr__;
}

Assistant:

NodeSourceInfoBuilderPair newGroupNode(schema::Node::Reader parent, Declaration::Reader decl) {
    AuxNode aux {
      translator.orphanage.newOrphan<schema::Node>(),
      translator.orphanage.newOrphan<schema::Node::SourceInfo>()
    };
    auto node = aux.node.get();
    auto sourceInfo = aux.sourceInfo.get();
    auto name = decl.getName().getValue();

    // We'll set the ID and scope ID later.
    node.setDisplayName(kj::str(parent.getDisplayName(), '.', name));
    node.setDisplayNamePrefixLength(node.getDisplayName().size() - name.size());
    node.setIsGeneric(parent.getIsGeneric());
    node.initStruct().setIsGroup(true);
    node.setStartByte(decl.getStartByte());
    node.setEndByte(decl.getEndByte());

    sourceInfo.setStartByte(decl.getStartByte());
    sourceInfo.setEndByte(decl.getEndByte());

    // The remaining contents of node.struct will be filled in later.

    translator.groups.add(kj::mv(aux));
    return { node, sourceInfo };
  }